

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_startSection(qpTestLog *log,char *name,char *description)

{
  deBool dVar1;
  long lVar2;
  undefined1 local_b0 [16];
  char *local_a0;
  char *local_98;
  undefined1 local_90 [16];
  char *local_80;
  char *local_78;
  int local_6c;
  undefined1 local_68 [4];
  int numAttribs;
  qpXmlAttribute attribs [2];
  char *description_local;
  char *name_local;
  qpTestLog *log_local;
  
  local_6c = 0;
  attribs[1]._24_8_ = description;
  deMutex_lock(log->lock);
  lVar2 = (long)local_6c;
  local_6c = local_6c + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_90,"Name",name);
  *(undefined8 *)(local_68 + lVar2 * 0x20) = local_90._0_8_;
  attribs[lVar2].name = (char *)local_90._8_8_;
  *(char **)&attribs[lVar2].type = local_80;
  attribs[lVar2].stringValue = local_78;
  if (attribs[1]._24_8_ != 0) {
    lVar2 = (long)local_6c;
    local_6c = local_6c + 1;
    qpSetStringAttrib((qpXmlAttribute *)local_b0,"Description",(char *)attribs[1]._24_8_);
    *(undefined8 *)(local_68 + lVar2 * 0x20) = local_b0._0_8_;
    attribs[lVar2].name = (char *)local_b0._8_8_;
    *(char **)&attribs[lVar2].type = local_a0;
    attribs[lVar2].stringValue = local_98;
  }
  dVar1 = qpXmlWriter_startElement(log->writer,"Section",local_6c,(qpXmlAttribute *)local_68);
  if (dVar1 != 0) {
    deMutex_unlock(log->lock);
  }
  else {
    qpPrintf("qpTestLog_startSection(): Writing XML failed\n");
    deMutex_unlock(log->lock);
  }
  log_local._4_4_ = (uint)(dVar1 != 0);
  return log_local._4_4_;
}

Assistant:

deBool qpTestLog_startSection (qpTestLog* log, const char* name, const char* description)
{
	qpXmlAttribute	attribs[2];
	int				numAttribs = 0;

	DE_ASSERT(log && name);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	if (description)
		attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* <Section Name="<name>" Description="<description>"> */
	if (!qpXmlWriter_startElement(log->writer, "Section", numAttribs, attribs))
	{
		qpPrintf("qpTestLog_startSection(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_SECTION));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}